

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::createCompositeCompare
          (Builder *this,Decoration precision,Id value1,Id value2,bool equal)

{
  Instruction *pIVar1;
  pointer ppIVar2;
  Id IVar3;
  uint size;
  Id IVar4;
  Id IVar5;
  uint uVar6;
  Op OVar7;
  Id IVar8;
  uint *puVar9;
  uint __tmp;
  uint uVar10;
  Decoration local_74;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  IVar3 = makeBoolType(this);
  pIVar1 = (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[value1];
  if (pIVar1 == (Instruction *)0x0) {
    uVar10 = 0;
  }
  else {
    uVar10 = pIVar1->typeId;
  }
  size = getNumTypeConstituents(this,uVar10);
  ppIVar2 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  OVar7 = ppIVar2[uVar10]->opCode;
  if (OVar7 < OpTypeOpaque) {
    if ((0xf00000U >> (OVar7 & OpTypeOpaque) & 1) != 0) {
      pIVar1 = ppIVar2[value2];
      if (pIVar1 == (Instruction *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = pIVar1->typeId;
      }
      if (uVar10 != uVar6) {
        __assert_fail("valueType == getTypeId(value2)",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0xd4c,"Id spv::Builder::createCompositeCompare(Decoration, Id, Id, bool)");
      }
      OVar7 = getMostBasicTypeClass(this,uVar10);
      if (OVar7 == OpTypeBool) {
        OVar7 = equal ^ OpLogicalNotEqual;
        local_74 = DecorationMax;
      }
      else {
        local_74 = precision;
        if (OVar7 == OpTypeFloat) {
          OVar7 = (uint)!equal + (uint)!equal * 2 + OpFOrdEqual;
        }
        else {
          OVar7 = equal ^ OpINotEqual;
        }
      }
      if ((this->module).idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10]->opCode - OpTypeBool < 3) {
        IVar3 = createBinOp(this,OVar7,IVar3,value1,value2);
      }
      else {
        IVar8 = makeVectorType(this,IVar3,size);
        IVar8 = createBinOp(this,OVar7,IVar8,value1,value2);
        if ((local_74 != DecorationMax) && (IVar8 != 0)) {
          addDecoration(this,IVar8,local_74,-1);
        }
        IVar3 = createUnaryOp(this,equal | OpAny,IVar3,IVar8);
      }
      if (local_74 == DecorationMax) {
        return IVar3;
      }
      if (IVar3 == 0) {
        return 0;
      }
      addDecoration(this,IVar3,local_74,-1);
      return IVar3;
    }
    if ((0x51000000U >> (OVar7 & OpTypeOpaque) & 1) != 0) goto LAB_003d93aa;
  }
  if ((OVar7 != OpTypeCooperativeMatrixKHR) && (OVar7 != OpTypeCooperativeMatrixNV)) {
    __assert_fail("isAggregateType(valueType) || isMatrixType(valueType)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0xd6e,"Id spv::Builder::createCompositeCompare(Decoration, Id, Id, bool)");
  }
LAB_003d93aa:
  if ((int)size < 1) {
    IVar8 = 0;
  }
  else {
    IVar8 = 0;
    uVar10 = 0;
    do {
      puVar9 = (uint *)operator_new(4);
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar9 + 1;
      *puVar9 = uVar10;
      pIVar1 = (this->module).idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[value1];
      IVar4 = 0;
      if (pIVar1 != (Instruction *)0x0) {
        IVar4 = pIVar1->typeId;
      }
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = puVar9;
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      IVar4 = getContainedTypeId(this,IVar4,uVar10);
      pIVar1 = (this->module).idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[value2];
      if (pIVar1 == (Instruction *)0x0) {
        IVar5 = 0;
      }
      else {
        IVar5 = pIVar1->typeId;
      }
      IVar5 = getContainedTypeId(this,IVar5,uVar10);
      IVar4 = createCompositeExtract(this,value1,IVar4,&local_48);
      IVar5 = createCompositeExtract(this,value2,IVar5,&local_48);
      IVar4 = createCompositeCompare(this,precision,IVar4,IVar5,equal);
      if (((uVar10 != 0) &&
          (IVar4 = createBinOp(this,equal + OpLogicalOr,IVar3,IVar8,IVar4),
          precision != DecorationMax)) && (IVar4 != 0)) {
        addDecoration(this,IVar4,precision,-1);
      }
      IVar8 = IVar4;
      operator_delete(puVar9,4);
      uVar10 = uVar10 + 1;
    } while (size != uVar10);
  }
  return IVar8;
}

Assistant:

Id Builder::createCompositeCompare(Decoration precision, Id value1, Id value2, bool equal)
{
    Id boolType = makeBoolType();
    Id valueType = getTypeId(value1);

    Id resultId = NoResult;

    int numConstituents = getNumTypeConstituents(valueType);

    // Scalars and Vectors

    if (isScalarType(valueType) || isVectorType(valueType)) {
        assert(valueType == getTypeId(value2));
        // These just need a single comparison, just have
        // to figure out what it is.
        Op op;
        switch (getMostBasicTypeClass(valueType)) {
        case OpTypeFloat:
            op = equal ? OpFOrdEqual : OpFUnordNotEqual;
            break;
        case OpTypeInt:
        default:
            op = equal ? OpIEqual : OpINotEqual;
            break;
        case OpTypeBool:
            op = equal ? OpLogicalEqual : OpLogicalNotEqual;
            precision = NoPrecision;
            break;
        }

        if (isScalarType(valueType)) {
            // scalar
            resultId = createBinOp(op, boolType, value1, value2);
        } else {
            // vector
            resultId = createBinOp(op, makeVectorType(boolType, numConstituents), value1, value2);
            setPrecision(resultId, precision);
            // reduce vector compares...
            resultId = createUnaryOp(equal ? OpAll : OpAny, boolType, resultId);
        }

        return setPrecision(resultId, precision);
    }

    // Only structs, arrays, and matrices should be left.
    // They share in common the reduction operation across their constituents.
    assert(isAggregateType(valueType) || isMatrixType(valueType));

    // Compare each pair of constituents
    for (int constituent = 0; constituent < numConstituents; ++constituent) {
        std::vector<unsigned> indexes(1, constituent);
        Id constituentType1 = getContainedTypeId(getTypeId(value1), constituent);
        Id constituentType2 = getContainedTypeId(getTypeId(value2), constituent);
        Id constituent1 = createCompositeExtract(value1, constituentType1, indexes);
        Id constituent2 = createCompositeExtract(value2, constituentType2, indexes);

        Id subResultId = createCompositeCompare(precision, constituent1, constituent2, equal);

        if (constituent == 0)
            resultId = subResultId;
        else
            resultId = setPrecision(createBinOp(equal ? OpLogicalAnd : OpLogicalOr, boolType, resultId, subResultId),
                                    precision);
    }

    return resultId;
}